

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::TrimFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc7c;
  FunctionNullHandling in_stack_fffffffffffffc88;
  allocator_type local_371;
  undefined8 in_stack_fffffffffffffc90;
  code *bind_lambda;
  code *local_350 [2];
  code *local_340;
  code *local_338;
  LogicalType local_330 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2e8;
  LogicalType local_2d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2b8;
  LogicalType local_2a0;
  LogicalType local_288;
  ScalarFunction local_270;
  ScalarFunction local_148;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(local_330,VARCHAR);
  __l._M_len = 1;
  __l._M_array = local_330;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2b8,__l,&local_371);
  LogicalType::LogicalType(&local_2d0,VARCHAR);
  local_350[1] = (code *)0x0;
  local_350[0] = UnaryTrimFunction<true,true>;
  local_338 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_340 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_288,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_288;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffc74;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffc7c;
  ScalarFunction::ScalarFunction
            (&local_148,(vector<duckdb::LogicalType,_true> *)&local_2b8,&local_2d0,
             (scalar_function_t *)local_350,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffc88,
             (bind_lambda_function_t)in_stack_fffffffffffffc90);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_148);
  ScalarFunction::~ScalarFunction(&local_148);
  LogicalType::~LogicalType(&local_288);
  ::std::_Function_base::~_Function_base((_Function_base *)local_350);
  LogicalType::~LogicalType(&local_2d0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2b8);
  LogicalType::~LogicalType(local_330);
  LogicalType::LogicalType(local_330,VARCHAR);
  LogicalType::LogicalType(local_330 + 1,VARCHAR);
  __l_00._M_len = 2;
  __l_00._M_array = local_330;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2e8,__l_00,&local_371);
  LogicalType::LogicalType(local_330 + 2,VARCHAR);
  bind_lambda = BinaryTrimFunction<true,true>;
  LogicalType::LogicalType(&local_2a0,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_2a0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffc74;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffc7c;
  ScalarFunction::ScalarFunction
            (&local_270,(vector<duckdb::LogicalType,_true> *)&local_2e8,local_330 + 2,
             (scalar_function_t *)&stack0xfffffffffffffc90,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffffc88,bind_lambda);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_270);
  ScalarFunction::~ScalarFunction(&local_270);
  LogicalType::~LogicalType(&local_2a0);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffc90);
  LogicalType::~LogicalType(local_330 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2e8);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_330[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return in_RDI;
}

Assistant:

ScalarFunctionSet TrimFun::GetFunctions() {
	ScalarFunctionSet trim;
	trim.AddFunction(ScalarFunction({LogicalType::VARCHAR}, LogicalType::VARCHAR, UnaryTrimFunction<true, true>));

	trim.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::VARCHAR,
	                                BinaryTrimFunction<true, true>));
	return trim;
}